

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestInfo
               (ostream *stream,char *test_suite_name,TestInfo *test_info)

{
  TestResult *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  ostream *poVar3;
  TestPartResult *pTVar4;
  string *value;
  size_t width;
  size_t width_00;
  TimeInMillis ms;
  TimeInMillis ms_00;
  size_t width_01;
  int iVar5;
  _Alloc_hider _Var6;
  char *pcVar7;
  internal *this_00;
  int i;
  int i_00;
  string location;
  string message;
  string kIndent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string kTestsuite;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kTestsuite,"testcase",(allocator<char> *)&kIndent);
  Indent_abi_cxx11_(&kIndent,(internal *)0xa,width);
  Indent_abi_cxx11_(&location,(internal *)0x8,width_00);
  poVar3 = std::operator<<(stream,(string *)&location);
  std::operator<<(poVar3,"{\n");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&location,"name",(allocator<char> *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&message,(test_info->name_)._M_dataplus._M_p,(allocator<char> *)&local_50);
  OutputJsonKey(stream,&kTestsuite,&location,&message,&kIndent,true);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  pbVar1 = (test_info->value_param_)._M_t.
           super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&location,"value_param",(allocator<char> *)&local_98);
    pbVar1 = (test_info->value_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var6._M_p = (char *)0x0;
    }
    else {
      _Var6._M_p = (pbVar1->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message,_Var6._M_p,(allocator<char> *)&local_50);
    OutputJsonKey(stream,&kTestsuite,&location,&message,&kIndent,true);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  pbVar1 = (test_info->type_param_)._M_t.
           super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&location,"type_param",(allocator<char> *)&local_98);
    pbVar1 = (test_info->type_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var6._M_p = (char *)0x0;
    }
    else {
      _Var6._M_p = (pbVar1->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message,_Var6._M_p,(allocator<char> *)&local_50);
    OutputJsonKey(stream,&kTestsuite,&location,&message,&kIndent,true);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  if (FLAGS_gtest_list_tests == '\x01') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&location,"file",(allocator<char> *)&local_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message,(test_info->location_).file._M_dataplus._M_p,
               (allocator<char> *)&local_50);
    OutputJsonKey(stream,&kTestsuite,&location,&message,&kIndent,true);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&location,"line",(allocator<char> *)&message);
    OutputJsonKey(stream,&kTestsuite,&location,(test_info->location_).line,&kIndent,false);
    std::__cxx11::string::_M_dispose();
  }
  else {
    this = &test_info->result_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&location,"status",(allocator<char> *)&local_98);
    pcVar7 = "NOTRUN";
    if (test_info->should_run_ != false) {
      pcVar7 = "RUN";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message,pcVar7,(allocator<char> *)&local_50);
    OutputJsonKey(stream,&kTestsuite,&location,&message,&kIndent,true);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&location,"result",(allocator<char> *)&local_98);
    if (test_info->should_run_ == true) {
      bVar2 = TestResult::Skipped(this);
      pcVar7 = "COMPLETED";
      if (bVar2) {
        pcVar7 = "SKIPPED";
      }
    }
    else {
      pcVar7 = "SUPPRESSED";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message,pcVar7,(allocator<char> *)&local_50);
    OutputJsonKey(stream,&kTestsuite,&location,&message,&kIndent,true);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&location,"timestamp",(allocator<char> *)&local_98);
    FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
              (&message,(internal *)(test_info->result_).start_timestamp_,ms);
    OutputJsonKey(stream,&kTestsuite,&location,&message,&kIndent,true);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&location,"time",(allocator<char> *)&local_98);
    FormatTimeInMillisAsDuration_abi_cxx11_
              (&message,(internal *)(test_info->result_).elapsed_time_,ms_00);
    OutputJsonKey(stream,&kTestsuite,&location,&message,&kIndent,true);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&location,"classname",(allocator<char> *)&local_98);
    value = &message;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)value,test_suite_name,(allocator<char> *)&local_50);
    iVar5 = 0;
    OutputJsonKey(stream,&kTestsuite,&location,value,&kIndent,false);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    TestPropertiesAsJson(&location,this,&kIndent);
    std::operator<<(stream,(string *)&location);
    std::__cxx11::string::_M_dispose();
    for (i_00 = 0;
        i_00 < (int)(((long)(test_info->result_).test_part_results_.
                            super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(test_info->result_).test_part_results_.
                           super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x70); i_00 = i_00 + 1) {
      pTVar4 = TestResult::GetTestPartResult(this,i_00);
      if (pTVar4->type_ - kNonFatalFailure < 2) {
        std::operator<<(stream,",\n");
        if (iVar5 == 0) {
          poVar3 = std::operator<<(stream,(string *)&kIndent);
          poVar3 = std::operator<<(poVar3,"\"");
          poVar3 = std::operator<<(poVar3,"failures");
          std::operator<<(poVar3,"\": [\n");
        }
        this_00 = (internal *)(pTVar4->file_name_)._M_string_length;
        if (this_00 != (internal *)0x0) {
          this_00 = (internal *)(pTVar4->file_name_)._M_dataplus._M_p;
        }
        iVar5 = iVar5 + 1;
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  (&location,this_00,(char *)(ulong)(uint)pTVar4->line_number_,(int)value);
        std::operator+(&local_50,&location,"\n");
        std::operator+(&local_98,&local_50,(pTVar4->message_)._M_dataplus._M_p);
        EscapeJson(&message,&local_98);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        poVar3 = std::operator<<(stream,(string *)&kIndent);
        poVar3 = std::operator<<(poVar3,"  {\n");
        poVar3 = std::operator<<(poVar3,(string *)&kIndent);
        poVar3 = std::operator<<(poVar3,"    \"failure\": \"");
        poVar3 = std::operator<<(poVar3,(string *)&message);
        poVar3 = std::operator<<(poVar3,"\",\n");
        poVar3 = std::operator<<(poVar3,(string *)&kIndent);
        poVar3 = std::operator<<(poVar3,"    \"type\": \"\"\n");
        poVar3 = std::operator<<(poVar3,(string *)&kIndent);
        std::operator<<(poVar3,"  }");
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
      }
    }
    if (0 < iVar5) {
      poVar3 = std::operator<<(stream,"\n");
      poVar3 = std::operator<<(poVar3,(string *)&kIndent);
      std::operator<<(poVar3,"]");
    }
  }
  poVar3 = std::operator<<(stream,"\n");
  Indent_abi_cxx11_(&location,(internal *)0x8,width_01);
  poVar3 = std::operator<<(poVar3,(string *)&location);
  std::operator<<(poVar3,"}");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestInfo(::std::ostream* stream,
                                                   const char* test_suite_name,
                                                   const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestsuite = "testcase";
  const std::string kIndent = Indent(10);

  *stream << Indent(8) << "{\n";
  OutputJsonKey(stream, kTestsuite, "name", test_info.name(), kIndent);

  if (test_info.value_param() != nullptr) {
    OutputJsonKey(stream, kTestsuite, "value_param", test_info.value_param(),
                  kIndent);
  }
  if (test_info.type_param() != nullptr) {
    OutputJsonKey(stream, kTestsuite, "type_param", test_info.type_param(),
                  kIndent);
  }
  if (GTEST_FLAG(list_tests)) {
    OutputJsonKey(stream, kTestsuite, "file", test_info.file(), kIndent);
    OutputJsonKey(stream, kTestsuite, "line", test_info.line(), kIndent, false);
    *stream << "\n" << Indent(8) << "}";
    return;
  }

  OutputJsonKey(stream, kTestsuite, "status",
                test_info.should_run() ? "RUN" : "NOTRUN", kIndent);
  OutputJsonKey(stream, kTestsuite, "result",
                test_info.should_run()
                    ? (result.Skipped() ? "SKIPPED" : "COMPLETED")
                    : "SUPPRESSED",
                kIndent);
  OutputJsonKey(stream, kTestsuite, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuite, "time",
                FormatTimeInMillisAsDuration(result.elapsed_time()), kIndent);
  OutputJsonKey(stream, kTestsuite, "classname", test_suite_name, kIndent,
                false);
  *stream << TestPropertiesAsJson(result, kIndent);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      *stream << ",\n";
      if (++failures == 1) {
        *stream << kIndent << "\"" << "failures" << "\": [\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string message = EscapeJson(location + "\n" + part.message());
      *stream << kIndent << "  {\n"
              << kIndent << "    \"failure\": \"" << message << "\",\n"
              << kIndent << "    \"type\": \"\"\n"
              << kIndent << "  }";
    }
  }

  if (failures > 0)
    *stream << "\n" << kIndent << "]";
  *stream << "\n" << Indent(8) << "}";
}